

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  Lookaside *pLVar1;
  ushort uVar2;
  sqlite3 *db;
  Table *pTVar3;
  char *__s;
  undefined1 uVar4;
  u16 uVar5;
  int iVar6;
  uint uVar7;
  HashElem *pHVar8;
  sColMap *psVar9;
  size_t sVar10;
  Expr *pEVar11;
  Expr *pEVar12;
  Expr *pRight;
  SrcList *pSrc;
  char *pcVar13;
  ExprList *pEVar14;
  Select *pDup;
  Trigger *p;
  Schema *pSVar15;
  Select *pSVar16;
  i16 *piVar17;
  Schema **ppSVar18;
  FKey *p_00;
  uint uVar19;
  long lVar20;
  long lVar21;
  u8 uVar22;
  long lVar23;
  bool bVar24;
  TriggerStep *local_108;
  Expr *local_f8;
  ExprList *local_d0;
  Expr *local_c8;
  int *aiCol;
  int local_a0;
  int local_9c;
  Token tOld;
  Index *pIdx;
  int *local_80;
  i16 *local_78;
  sColMap *local_70;
  Token local_68;
  Token tFromCol;
  Token tNew;
  
  if ((pParse->db->flags & 0x4000) != 0) {
    local_9c = regOld;
    pHVar8 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
    p_00 = (FKey *)pHVar8->data;
    if (p_00 != (FKey *)0x0) {
      bVar24 = pChanges != (ExprList *)0x0;
      local_78 = &pTab->iPKey;
      local_a0 = bChngRowid;
      local_80 = aChange;
      do {
        if ((aChange == (int *)0x0) ||
           (iVar6 = fkParentIsModified(pTab,p_00,aChange,bChngRowid), iVar6 != 0)) {
          db = pParse->db;
          uVar22 = p_00->aAction[bVar24];
          if ((db->flags >> 0x23 & 1) != 0) {
            uVar22 = '\0';
          }
          if ((((uint)db->flags >> 0x13 & 1) == 0) || (uVar22 != '\a')) {
            p = p_00->apTrigger[bVar24];
            if ((uVar22 == '\0') || (p != (Trigger *)0x0)) {
              if (p != (Trigger *)0x0) {
LAB_00196897:
                sqlite3CodeRowTriggerDirect(pParse,p,pTab,local_9c,2,0);
              }
            }
            else {
              pIdx = (Index *)0x0;
              aiCol = (int *)0x0;
              iVar6 = sqlite3FkLocateIndex(pParse,pTab,p_00,&pIdx,&aiCol);
              if (iVar6 == 0) {
                if (p_00->nCol < 1) {
                  local_f8 = (Expr *)0x0;
                  local_d0 = (ExprList *)0x0;
                  local_c8 = (Expr *)0x0;
                }
                else {
                  local_70 = p_00->aCol;
                  lVar20 = 0;
                  lVar23 = 0;
                  lVar21 = 0;
                  local_c8 = (Expr *)0x0;
                  local_d0 = (ExprList *)0x0;
                  local_f8 = (Expr *)0x0;
                  do {
                    tOld.z = "old";
                    tOld.n = 3;
                    tOld._12_4_ = 0;
                    psVar9 = (sColMap *)((long)aiCol + lVar20);
                    if (aiCol == (int *)0x0) {
                      psVar9 = local_70;
                    }
                    tNew.z = "new";
                    tNew.n = 3;
                    tNew._12_4_ = 0;
                    piVar17 = local_78;
                    if (pIdx != (Index *)0x0) {
                      piVar17 = (i16 *)((long)pIdx->aiColumn + lVar23);
                    }
                    iVar6 = psVar9->iFrom;
                    local_68.z = pTab->aCol[*piVar17].zCnName;
                    uVar19 = 0;
                    uVar7 = 0;
                    if (local_68.z != (char *)0x0) {
                      sVar10 = strlen(local_68.z);
                      uVar7 = (uint)sVar10 & 0x3fffffff;
                    }
                    tFromCol.z = p_00->pFrom->aCol[iVar6].zCnName;
                    local_68.n = uVar7;
                    if (tFromCol.z != (char *)0x0) {
                      sVar10 = strlen(tFromCol.z);
                      uVar19 = (uint)sVar10 & 0x3fffffff;
                    }
                    tFromCol.n = uVar19;
                    pEVar11 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                    pEVar12 = sqlite3ExprAlloc(db,0x3b,&local_68,0);
                    pEVar11 = sqlite3PExpr(pParse,0x8d,pEVar11,pEVar12);
                    pEVar12 = sqlite3ExprAlloc(db,0x3b,&tFromCol,0);
                    pEVar11 = sqlite3PExpr(pParse,0x35,pEVar11,pEVar12);
                    local_f8 = sqlite3ExprAnd(pParse,local_f8,pEVar11);
                    if (pChanges != (ExprList *)0x0) {
                      pEVar11 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                      pEVar12 = sqlite3ExprAlloc(db,0x3b,&local_68,0);
                      pEVar11 = sqlite3PExpr(pParse,0x8d,pEVar11,pEVar12);
                      pEVar12 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                      pRight = sqlite3ExprAlloc(db,0x3b,&local_68,0);
                      pEVar12 = sqlite3PExpr(pParse,0x8d,pEVar12,pRight);
                      pEVar11 = sqlite3PExpr(pParse,0x2d,pEVar11,pEVar12);
                      local_c8 = sqlite3ExprAnd(pParse,local_c8,pEVar11);
                    }
                    if ((uVar22 != '\n' || pChanges != (ExprList *)0x0) && uVar22 != '\a') {
                      if (uVar22 == '\t') {
                        pTVar3 = p_00->pFrom;
                        if ((((((pTVar3->aCol[iVar6].colFlags & 0x60) == 0) &&
                              (uVar2 = pTVar3->aCol[iVar6].iDflt, uVar2 != 0)) &&
                             (pTVar3->eTabType == '\0')) &&
                            ((pEVar14 = (pTVar3->u).tab.pDfltList, pEVar14 != (ExprList *)0x0 &&
                             ((int)(uint)uVar2 <= pEVar14->nExpr)))) &&
                           (pEVar11 = pEVar14->a[uVar2 - 1].pExpr, pEVar11 != (Expr *)0x0)) {
                          pEVar11 = exprDup(db,pEVar11,0,(EdupBuf *)0x0);
                        }
                        else {
                          pEVar11 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
                          if (pEVar11 == (Expr *)0x0) {
                            pEVar11 = (Expr *)0x0;
                          }
                          else {
                            pEVar11->op = '\0';
                            pEVar11->affExpr = '\0';
                            pEVar11->op2 = '\0';
                            pEVar11->field_0x3 = 0;
                            pEVar11->flags = 0;
                            (pEVar11->u).zToken = (char *)0x0;
                            pEVar11->iColumn = 0;
                            pEVar11->iAgg = 0;
                            pEVar11->w = (anon_union_4_2_009eaf8f_for_w)0x0;
                            pEVar11->pAggInfo = (AggInfo *)0x0;
                            (pEVar11->x).pList = (ExprList *)0x0;
                            pEVar11->nHeight = 0;
                            pEVar11->iTable = 0;
                            pEVar11->pLeft = (Expr *)0x0;
                            pEVar11->pRight = (Expr *)0x0;
                            (pEVar11->y).pTab = (Table *)0x0;
                            pEVar11->op = 'y';
                            pEVar11->iAgg = -1;
                            pEVar11->nHeight = 1;
                          }
                        }
                      }
                      else if (uVar22 == '\n') {
                        pEVar11 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                        pEVar12 = sqlite3ExprAlloc(db,0x3b,&local_68,0);
                        pEVar11 = sqlite3PExpr(pParse,0x8d,pEVar11,pEVar12);
                      }
                      else {
                        pEVar11 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
                        if (pEVar11 == (Expr *)0x0) {
                          pEVar11 = (Expr *)0x0;
                        }
                        else {
                          pEVar11->op = '\0';
                          pEVar11->affExpr = '\0';
                          pEVar11->op2 = '\0';
                          pEVar11->field_0x3 = 0;
                          pEVar11->flags = 0;
                          (pEVar11->u).zToken = (char *)0x0;
                          pEVar11->iColumn = 0;
                          pEVar11->iAgg = 0;
                          pEVar11->w = (anon_union_4_2_009eaf8f_for_w)0x0;
                          pEVar11->pAggInfo = (AggInfo *)0x0;
                          (pEVar11->x).pList = (ExprList *)0x0;
                          pEVar11->nHeight = 0;
                          pEVar11->iTable = 0;
                          pEVar11->pLeft = (Expr *)0x0;
                          pEVar11->pRight = (Expr *)0x0;
                          (pEVar11->y).pTab = (Table *)0x0;
                          pEVar11->op = 'y';
                          pEVar11->iAgg = -1;
                          pEVar11->nHeight = 1;
                        }
                      }
                      local_d0 = sqlite3ExprListAppend(pParse,local_d0,pEVar11);
                      sqlite3ExprListSetName(pParse,local_d0,&tFromCol,0);
                    }
                    lVar21 = lVar21 + 1;
                    lVar23 = lVar23 + 2;
                    lVar20 = lVar20 + 4;
                  } while (lVar21 < p_00->nCol);
                }
                if (aiCol != (int *)0x0) {
                  sqlite3DbFreeNN(db,aiCol);
                }
                aChange = local_80;
                bChngRowid = local_a0;
                __s = p_00->pFrom->zName;
                if (__s == (char *)0x0) {
                  sVar10 = 0;
                }
                else {
                  sVar10 = strlen(__s);
                  sVar10 = (size_t)((uint)sVar10 & 0x3fffffff);
                }
                if (uVar22 == '\a') {
                  if (pTab->pSchema == (Schema *)0x0) {
                    lVar20 = -0x8000;
                  }
                  else {
                    lVar20 = -0x100000000;
                    ppSVar18 = &db->aDb->pSchema;
                    do {
                      lVar20 = lVar20 + 0x100000000;
                      pSVar15 = *ppSVar18;
                      ppSVar18 = ppSVar18 + 4;
                    } while (pSVar15 != pTab->pSchema);
                    lVar20 = lVar20 >> 0x20;
                  }
                  tOld.z = "FOREIGN KEY constraint failed";
                  tOld.n = 0x1d;
                  pEVar11 = sqlite3ExprAlloc(db,0x47,&tOld,0);
                  if (pEVar11 != (Expr *)0x0) {
                    pEVar11->affExpr = '\x02';
                  }
                  pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
                  if (pSrc == (SrcList *)0x0) {
                    pEVar14 = sqlite3ExprListAppendNew(pParse->db,pEVar11);
                    pSrc = (SrcList *)0x0;
                  }
                  else {
                    pcVar13 = sqlite3DbStrDup(db,__s);
                    pSrc->a[0].zName = pcVar13;
                    pcVar13 = sqlite3DbStrDup(db,db->aDb[lVar20].zDbSName);
                    pSrc->a[0].zDatabase = pcVar13;
                    pEVar14 = sqlite3ExprListAppendNew(pParse->db,pEVar11);
                  }
                  pDup = sqlite3SelectNew(pParse,pEVar14,pSrc,local_f8,(ExprList *)0x0,(Expr *)0x0,
                                          (ExprList *)0x0,0,(Expr *)0x0);
                  local_f8 = (Expr *)0x0;
                }
                else {
                  pDup = (Select *)0x0;
                }
                (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
                (db->lookaside).sz = 0;
                p = (Trigger *)sqlite3DbMallocZero(db,sVar10 + 0xa9);
                if (p == (Trigger *)0x0) {
                  local_108 = (TriggerStep *)0x0;
                }
                else {
                  local_108 = (TriggerStep *)(p + 1);
                  p->step_list = local_108;
                  p[1].pWhen = (Expr *)&p[2].pWhen;
                  memcpy(&p[2].pWhen,__s,sVar10);
                  if (local_f8 == (Expr *)0x0) {
                    pSVar15 = (Schema *)0x0;
                  }
                  else {
                    pSVar15 = (Schema *)exprDup(db,local_f8,1,(EdupBuf *)0x0);
                  }
                  p[1].pSchema = pSVar15;
                  pSVar15 = (Schema *)sqlite3ExprListDup(db,local_d0,1);
                  p[1].pTabSchema = pSVar15;
                  pSVar16 = sqlite3SelectDup(db,pDup,1);
                  *(Select **)&p[1].op = pSVar16;
                  if (local_c8 == (Expr *)0x0) {
                    local_c8 = (Expr *)0x0;
                  }
                  else {
                    local_c8 = sqlite3PExpr(pParse,0x13,local_c8,(Expr *)0x0);
                    pEVar11 = (Expr *)0x0;
                    if (local_c8 != (Expr *)0x0) {
                      pEVar11 = exprDup(db,local_c8,1,(EdupBuf *)0x0);
                    }
                    p->pWhen = pEVar11;
                  }
                }
                pLVar1 = &db->lookaside;
                pLVar1->bDisable = pLVar1->bDisable - 1;
                if (pLVar1->bDisable == 0) {
                  uVar5 = (db->lookaside).szTrue;
                }
                else {
                  uVar5 = 0;
                }
                (db->lookaside).sz = uVar5;
                if (local_f8 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,local_f8);
                }
                if (local_c8 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,local_c8);
                }
                if (local_d0 != (ExprList *)0x0) {
                  exprListDeleteNN(db,local_d0);
                }
                if (pDup != (Select *)0x0) {
                  clearSelect(db,pDup,1);
                }
                if (db->mallocFailed != '\x01') {
                  if (uVar22 == '\a') {
                    uVar4 = 0x8a;
                  }
                  else if ((uVar22 == '\n') && (pChanges == (ExprList *)0x0)) {
                    uVar4 = 0x80;
                  }
                  else {
                    uVar4 = 0x81;
                  }
                  local_108->op = uVar4;
                  local_108->pTrig = p;
                  pSVar15 = pTab->pSchema;
                  p->pSchema = pSVar15;
                  p->pTabSchema = pSVar15;
                  p_00->apTrigger[bVar24] = p;
                  p->op = bVar24 | 0x80;
                  goto LAB_00196897;
                }
                fkTriggerDelete(db,p);
              }
            }
          }
        }
        p_00 = p_00->pNextTo;
      } while (p_00 != (FKey *)0x0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that
  ** refer to table pTab. If there is an action associated with the FK
  ** for this operation (either update or delete), invoke the associated
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}